

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_image_tga.cxx
# Opt level: O1

bool __thiscall xray_re::xr_image::save_tga(xr_image *this,char *path,char *name)

{
  bool bVar1;
  xr_memory_writer *this_00;
  allocator<char> local_49;
  string local_48;
  
  this_00 = (xr_memory_writer *)operator_new(0x2078);
  xr_memory_writer::xr_memory_writer(this_00);
  save_tga(this,(xr_writer *)this_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_49);
  bVar1 = xr_memory_writer::save_to(this_00,path,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  (*(this_00->super_xr_writer)._vptr_xr_writer[1])(this_00);
  return bVar1;
}

Assistant:

bool xr_image::save_tga(const char* path, const char* name) const
{
	xr_memory_writer* w = new xr_memory_writer();
	save_tga(*w);
	bool status = w->save_to(path, name);
	delete w;
	return status;
}